

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_remove(Context *context,IntrinsicResult partialResult)

{
  _func_int *p_Var1;
  _func_int *__s2;
  long *plVar2;
  anon_union_8_3_2f476f46_for_data aVar3;
  ValueType VVar4;
  Value *pVVar5;
  ListStorage<MiniScript::TACLine> *pLVar6;
  bool bVar7;
  uint uVar8;
  int32_t iVar9;
  int iVar10;
  long *plVar11;
  undefined4 *puVar12;
  ListStorage<MiniScript::Context_*> *pLVar13;
  undefined2 *puVar14;
  char *pcVar15;
  StringStorage *pSVar16;
  _func_int **pp_Var17;
  anon_union_8_3_2f476f46_for_data *paVar18;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar19;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar20;
  long max;
  code *numBytes;
  long lVar21;
  long startPos;
  String *msg;
  undefined *min;
  long lVar22;
  undefined *i;
  long lVar23;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *this;
  ValueDict selfMap;
  Value self;
  Value k;
  String substr;
  anon_union_8_3_2f476f46_for_data local_128;
  long *local_120;
  char local_118;
  undefined4 local_110;
  long *local_108;
  char local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  anon_union_8_3_2f476f46_for_data local_e0;
  anon_union_8_3_2f476f46_for_data local_d8;
  bool local_d0;
  Value local_c8;
  _func_int **local_b8;
  anon_union_8_3_2f476f46_for_data local_b0;
  undefined1 local_a8 [16];
  Value local_98;
  Value local_88;
  Value local_78;
  ListStorage<MiniScript::Context_*> *local_68;
  bool local_60;
  long *local_58;
  char local_50;
  String local_48;
  Context *local_38;
  
  local_50 = '\0';
  plVar11 = (long *)operator_new(0x30);
  plVar11[1] = 1;
  *plVar11 = (long)&PTR__StringStorage_001d10b0;
  plVar11[3] = 5;
  plVar11[4] = -1;
  puVar12 = (undefined4 *)operator_new__(5);
  plVar11[2] = (long)puVar12;
  *(undefined1 *)(puVar12 + 1) = 0;
  *puVar12 = 0x666c6573;
  local_58 = plVar11;
  Context::GetVar((Context *)local_f8,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (long *)0x0) && (local_50 == '\0')) {
    plVar11 = local_58 + 1;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  local_60 = false;
  pLVar13 = (ListStorage<MiniScript::Context_*> *)operator_new(0x30);
  (pLVar13->super_RefCountedStorage).refCount = 1;
  (pLVar13->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  (pLVar13->super_SimpleVector<MiniScript::Context_*>).mBuf = (Context **)0x2;
  (pLVar13->super_SimpleVector<MiniScript::Context_*>).mQtyItems = 0xffffffffffffffff;
  puVar14 = (undefined2 *)operator_new__(2);
  (pLVar13->super_SimpleVector<MiniScript::Context_*>).mBlockItems = (unsigned_long)puVar14;
  *puVar14 = 0;
  *puVar14 = 0x6b;
  local_68 = pLVar13;
  Context::GetVar((Context *)local_e8,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  iVar10 = (int)partialResult.rs;
  if ((local_68 != (ListStorage<MiniScript::Context_*> *)0x0) && (local_60 == false)) {
    plVar11 = &(local_68->super_RefCountedStorage).refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_68->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_68 = (ListStorage<MiniScript::Context_*> *)0x0;
  }
  if (local_f8[0] == Null) {
    plVar11 = (long *)operator_new(0x30);
    plVar11[1] = 1;
    *plVar11 = (long)&PTR__StringStorage_001d10b0;
    plVar11[3] = 0x26;
    plVar11[4] = -1;
    pcVar15 = (char *)operator_new__(0x26);
    plVar11[2] = (long)pcVar15;
    builtin_strncpy(pcVar15,"argument to \'remove\' must not be",0x20);
    plVar11[1] = plVar11[1] + 1;
    builtin_strncpy(pcVar15 + 0x1e,"be null",8);
    local_128.ref = (RefCountedStorage *)&PTR__MiniscriptException_001d1358;
    local_120 = (long *)0x0;
    local_118 = '\0';
    local_110 = 0;
    local_100 = '\0';
    local_108 = plVar11;
    if (plVar11[1] == 0) {
      (**(code **)(*plVar11 + 8))(plVar11);
    }
    local_128.ref = (RefCountedStorage *)&PTR__MiniscriptException_001d1308;
    RuntimeException::raise((RuntimeException *)&local_128,iVar10);
    local_128.number = (double)&PTR__MiniscriptException_001d1358;
    if ((local_108 != (long *)0x0) && (local_100 == '\0')) {
      plVar2 = local_108 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*local_108 + 8))();
      }
      local_108 = (long *)0x0;
    }
    if ((local_120 != (long *)0x0) && (local_118 == '\0')) {
      plVar2 = local_120 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*local_120 + 8))();
      }
      local_120 = (long *)0x0;
    }
    std::exception::~exception((exception *)&local_128);
    plVar2 = plVar11 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*plVar11 + 8))(plVar11);
    }
  }
  if (local_f8[0] == String) {
    if (local_e8[0] == Null) {
      plVar11 = (long *)operator_new(0x30);
      plVar11[1] = 1;
      *plVar11 = (long)&PTR__StringStorage_001d10b0;
      plVar11[3] = 0x26;
      plVar11[4] = -1;
      pcVar15 = (char *)operator_new__(0x26);
      plVar11[2] = (long)pcVar15;
      builtin_strncpy(pcVar15,"argument to \'remove\' must not be",0x20);
      plVar11[1] = plVar11[1] + 1;
      builtin_strncpy(pcVar15 + 0x1e,"be null",8);
      local_128.ref = (RefCountedStorage *)&PTR__MiniscriptException_001d1358;
      local_120 = (long *)0x0;
      local_118 = '\0';
      local_110 = 0;
      local_100 = '\0';
      local_108 = plVar11;
      if (plVar11[1] == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      local_128.ref = (RefCountedStorage *)&PTR__MiniscriptException_001d1308;
      RuntimeException::raise((RuntimeException *)&local_128,iVar10);
      local_128.number = (double)&PTR__MiniscriptException_001d1358;
      if ((local_108 != (long *)0x0) && (local_100 == '\0')) {
        plVar2 = local_108 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*local_108 + 8))();
        }
        local_108 = (long *)0x0;
      }
      if ((local_120 != (long *)0x0) && (local_118 == '\0')) {
        plVar2 = local_120 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*local_120 + 8))();
        }
        local_120 = (long *)0x0;
      }
      std::exception::~exception((exception *)&local_128);
      plVar2 = plVar11 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
    }
    if ((local_f8[0] & ~List) != String) {
      _Error("Assert failed: type == ValueType::String or type == ValueType::Var",
             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
             ,0x8f);
    }
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_f8._8_8_ ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      local_d8.number = 0.0;
    }
    else {
      *(long *)(local_f8._8_8_ + 8) = *(long *)(local_f8._8_8_ + 8) + 1;
      local_d8 = (anon_union_8_3_2f476f46_for_data)local_f8._8_8_;
    }
    local_d0 = false;
    Value::ToString((Value *)&local_b8,(Machine *)local_e8);
    lVar21 = -1;
    startPos = lVar21;
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_d8.ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      if (local_b8 == (_func_int **)0x0) {
        startPos = 0;
      }
      else {
        p_Var1 = local_b8[3];
        lVar22 = local_d8.ref[1].refCount - (long)p_Var1;
        if (-1 < lVar22) {
          pp_Var17 = local_d8.ref[1]._vptr_RefCountedStorage;
          __s2 = local_b8[2];
          lVar23 = 0;
          local_38 = context;
          do {
            iVar10 = strncmp((char *)(lVar23 + (long)pp_Var17),(char *)__s2,(size_t)(p_Var1 + -1));
            startPos = lVar23;
            context = local_38;
            if (iVar10 == 0) break;
            lVar23 = lVar23 + 1;
            startPos = lVar21;
          } while (lVar22 + 1 != lVar23);
        }
      }
    }
    if (startPos < 0) {
      local_c8.type = local_f8[0];
      local_c8.noInvoke = (bool)local_f8[1];
      local_c8.localOnly = local_f8[2];
      local_c8.data.ref = (RefCountedStorage *)local_f8._8_8_;
      if ((Temp < local_f8[0]) &&
         ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_f8._8_8_ !=
          (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
        *(long *)(local_f8._8_8_ + 8) = *(long *)(local_f8._8_8_ + 8) + 1;
      }
      ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3)
                       ,&local_c8);
      *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
      if ((Temp < local_c8.type) &&
         ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_c8.data.ref !=
          (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
        plVar11 = &(local_c8.data.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*((RefCountedStorage *)&(local_c8.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_c8.data.number = 0.0;
      }
    }
    else {
      if (local_b8 == (_func_int **)0x0) {
        numBytes = (code *)0x0;
      }
      else {
        numBytes = local_b8[3] + -1;
      }
      local_48.ss = (StringStorage *)0x0;
      local_48.isTemp = false;
      paVar18 = (anon_union_8_3_2f476f46_for_data *)
                String::ReplaceB((String *)&local_d8,startPos,(long)numBytes,&local_48);
      local_98.type = String;
      local_98.noInvoke = false;
      local_98.localOnly = Off;
      local_98.data.ref = paVar18->ref;
      if (paVar18->ref == (RefCountedStorage *)0x0) {
        local_98.data = DAT_001d3308;
      }
      if (local_98.data.ref != (RefCountedStorage *)0x0) {
        (local_98.data.ref)->refCount = (local_98.data.ref)->refCount + 1;
      }
      ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3)
                       ,&local_98);
      *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
      if ((Temp < local_98.type) && (local_98.data.ref != (RefCountedStorage *)0x0)) {
        plVar11 = &(local_98.data.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_98.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_98.data.number = 0.0;
      }
      if ((local_48.ss != (StringStorage *)0x0) && (local_48.isTemp == false)) {
        plVar11 = &((local_48.ss)->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*((local_48.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_48.ss = (StringStorage *)0x0;
      }
    }
    if ((local_b8 != (_func_int **)0x0) && (local_b0.tempNum._0_1_ == '\0')) {
      pp_Var17 = local_b8 + 1;
      *pp_Var17 = *pp_Var17 + -1;
      if (*pp_Var17 == (_func_int *)0x0) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (_func_int **)0x0;
    }
    if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_d8.ref !=
         (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) && (local_d0 == false)) {
      plVar11 = &(local_d8.ref)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (*((RefCountedStorage *)&(local_d8.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage
          [1])();
      }
      local_d8.number = 0.0;
    }
  }
  else if (local_f8[0] == List) {
    if (local_e8[0] == Null) {
      plVar11 = (long *)operator_new(0x30);
      plVar11[1] = 1;
      *plVar11 = (long)&PTR__StringStorage_001d10b0;
      plVar11[3] = 0x26;
      plVar11[4] = -1;
      pcVar15 = (char *)operator_new__(0x26);
      plVar11[2] = (long)pcVar15;
      builtin_strncpy(pcVar15,"argument to \'remove\' must not be",0x20);
      plVar11[1] = plVar11[1] + 1;
      builtin_strncpy(pcVar15 + 0x1e,"be null",8);
      local_128.ref = (RefCountedStorage *)&PTR__MiniscriptException_001d1358;
      local_120 = (long *)0x0;
      local_118 = '\0';
      local_110 = 0;
      local_100 = '\0';
      local_108 = plVar11;
      if (plVar11[1] == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      local_128.ref = (RefCountedStorage *)&PTR__MiniscriptException_001d1308;
      RuntimeException::raise((RuntimeException *)&local_128,iVar10);
      local_128.number = (double)&PTR__MiniscriptException_001d1358;
      if ((local_108 != (long *)0x0) && (local_100 == '\0')) {
        plVar2 = local_108 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*local_108 + 8))();
        }
        local_108 = (long *)0x0;
      }
      if ((local_120 != (long *)0x0) && (local_118 == '\0')) {
        plVar2 = local_120 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*local_120 + 8))();
        }
        local_120 = (long *)0x0;
      }
      std::exception::~exception((exception *)&local_128);
      plVar2 = plVar11 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
    }
    if (local_f8[0] != List) {
      _Error("Assert failed: type == ValueType::List",
             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
             ,0x94);
    }
    local_128.ref = (RefCountedStorage *)local_f8._8_8_;
    local_120 = (long *)((ulong)local_120 & 0xffffffffffffff00);
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_f8._8_8_ !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      *(long *)(local_f8._8_8_ + 8) = *(long *)(local_f8._8_8_ + 8) + 1;
    }
    iVar9 = Value::IntValue((Value *)local_e8);
    i = (undefined *)(long)iVar9;
    if (iVar9 < 0) {
      if (local_128.ref == (RefCountedStorage *)0x0) {
        pp_Var17 = (_func_int **)0x0;
      }
      else {
        pp_Var17 = local_128.ref[2]._vptr_RefCountedStorage;
      }
      i = (undefined *)((long)pp_Var17 + (long)i);
    }
    if (local_128.ref == (RefCountedStorage *)0x0) {
      min = (undefined *)0xffffffffffffffff;
    }
    else {
      min = (undefined *)((long)local_128.ref[2]._vptr_RefCountedStorage + -1);
    }
    CheckRange((long)i,(long)min,max);
    List<MiniScript::Value>::RemoveAt((List<MiniScript::Value> *)&local_128,(long)i);
    IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
    pLVar6 = IntrinsicResult::Null;
    (context->code).ls = IntrinsicResult::Null;
    if (pLVar6 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar11 = &(pLVar6->super_RefCountedStorage).refCount;
      *plVar11 = *plVar11 + 1;
    }
    if ((local_128.ref != (RefCountedStorage *)0x0) && ((char)local_120 == '\0')) {
      plVar11 = &(local_128.ref)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (*(local_128.ref)->_vptr_RefCountedStorage[1])();
        local_128.number = 0.0;
      }
    }
  }
  else if (local_f8[0] == Map) {
    Value::GetDict((ValueDict *)&local_128,(Value *)local_f8);
    if (local_120 == (long *)0x0) {
LAB_00155bbc:
      local_88.type = Value::zero;
      local_88.noInvoke = DAT_001d32e1;
      local_88.localOnly = DAT_001d32e2;
      local_88.data.ref = &DAT_001d32e8->super_RefCountedStorage;
      if ((Temp < Value::zero) && (DAT_001d32e8 != (IntrinsicResultStorage *)0x0)) {
        plVar11 = &(DAT_001d32e8->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + 1;
      }
      pVVar5 = &local_88;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_88);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      aVar3 = local_88.data;
      VVar4 = local_88.type;
    }
    else {
      uVar8 = HashValue((Value *)local_e8);
      plVar11 = local_120 + (ulong)(uVar8 % 0xfb) + 3;
      do {
        plVar11 = (long *)*plVar11;
        if (plVar11 == (long *)0x0) goto LAB_00155bbc;
        bVar7 = Value::operator==((Value *)(plVar11 + 1),(Value *)local_e8);
      } while (!bVar7);
      if (local_120 != (long *)0x0) {
        uVar8 = HashValue((Value *)local_e8);
        this = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
               (local_120 + (ulong)(uVar8 % 0xfb) + 3);
        pHVar20 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
        do {
          pHVar19 = pHVar20;
          this = this->next;
          if (this == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) goto LAB_00155725;
          bVar7 = Value::operator==(&this->key,(Value *)local_e8);
          pHVar20 = this;
        } while (!bVar7);
        pHVar20 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
                  (local_120 + (ulong)(uVar8 % 0xfb) + 3);
        if (pHVar19 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
          pHVar20 = pHVar19;
        }
        pHVar20->next = this->next;
        this->next = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
        HashMapEntry<MiniScript::Value,_MiniScript::Value>::~HashMapEntry(this);
        operator_delete(this,0x28);
        local_120[2] = local_120[2] + -1;
      }
LAB_00155725:
      local_78.type = Value::one;
      local_78.noInvoke = DAT_001d32f1;
      local_78.localOnly = DAT_001d32f2;
      local_78.data.ref = &DAT_001d32f8->super_RefCountedStorage;
      if ((Temp < Value::one) && (DAT_001d32f8 != (ListStorage<MiniScript::Value> *)0x0)) {
        plVar11 = &(DAT_001d32f8->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + 1;
      }
      pVVar5 = &local_78;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_78);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      aVar3 = local_78.data;
      VVar4 = local_78.type;
    }
    if ((Temp < VVar4) &&
       ((ListStorage<MiniScript::Value> *)aVar3.ref != (ListStorage<MiniScript::Value> *)0x0)) {
      plVar11 = &(aVar3.ref)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (*((RefCountedStorage *)&(aVar3.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
                  ();
      }
      (pVVar5->data).number = 0.0;
    }
    local_128.number = (double)&PTR__Dictionary_001d1238;
    if ((local_120 != (long *)0x0) && (local_118 == '\0')) {
      plVar11 = local_120 + 1;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (**(code **)(*local_120 + 8))();
      }
      local_120 = (long *)0x0;
    }
  }
  else {
    local_a8[8] = false;
    pSVar16 = (StringStorage *)operator_new(0x30);
    (pSVar16->super_RefCountedStorage).refCount = 1;
    (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar16->dataSize = 0x33;
    pSVar16->charCount = -1;
    pcVar15 = (char *)operator_new__(0x33);
    pSVar16->data = pcVar15;
    msg = (String *)local_a8;
    builtin_strncpy(pcVar15,"Type Error: \'remove\' requires map, list, or string",0x33);
    local_a8._0_8_ = pSVar16;
    TypeException::TypeException((TypeException *)&local_128,msg);
    TypeException::raise((TypeException *)&local_128,(int)msg);
    local_128.number = (double)&PTR__MiniscriptException_001d1358;
    if ((local_108 != (long *)0x0) && (local_100 == '\0')) {
      plVar11 = local_108 + 1;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (**(code **)(*local_108 + 8))();
      }
      local_108 = (long *)0x0;
    }
    if ((local_120 != (long *)0x0) && (local_118 == '\0')) {
      plVar11 = local_120 + 1;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (**(code **)(*local_120 + 8))();
      }
      local_120 = (long *)0x0;
    }
    std::exception::~exception((exception *)&local_128);
    if (((StringStorage *)local_a8._0_8_ != (StringStorage *)0x0) && ((bool)local_a8[8] == false)) {
      plVar11 = &((RefCountedStorage *)local_a8._0_8_)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (*((RefCountedStorage *)local_a8._0_8_)->_vptr_RefCountedStorage[1])();
      }
      local_a8._0_8_ = (StringStorage *)0x0;
    }
    IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
    pLVar6 = IntrinsicResult::Null;
    (context->code).ls = IntrinsicResult::Null;
    if (pLVar6 != (ListStorage<MiniScript::TACLine> *)0x0) {
      plVar11 = &(pLVar6->super_RefCountedStorage).refCount;
      *plVar11 = *plVar11 + 1;
    }
  }
  if ((Temp < local_e8[0]) && (local_e0.ref != (RefCountedStorage *)0x0)) {
    plVar11 = &(local_e0.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_e0.ref)->_vptr_RefCountedStorage[1])();
    }
    local_e0.number = 0.0;
  }
  if ((Temp < local_f8[0]) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_f8._8_8_ !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar11 = (long *)(local_f8._8_8_ + 8);
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*((RefCountedStorage *)local_f8._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value k = context->GetVar("k");
		if (self.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
		if (self.type == ValueType::Map) {
			ValueDict selfMap = self.GetDict();
			if (selfMap.ContainsKey(k)) {
				selfMap.Remove(k);
				return IntrinsicResult(Value::one);
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::List) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			ValueList selfList = self.GetList();
			long idx = k.IntValue();
			if (idx < 0) idx += selfList.Count();
			CheckRange(idx, 0, selfList.Count()-1);
			selfList.RemoveAt(idx);
			return IntrinsicResult::Null;
		} else if (self.type == ValueType::String) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			String selfStr = self.GetString();
			String substr = k.ToString();
			long foundPosB = selfStr.IndexOfB(substr);
			if (foundPosB < 0) return IntrinsicResult(self);
			return IntrinsicResult(selfStr.ReplaceB(foundPosB, substr.LengthB(), String()));
		}
		TypeException("Type Error: 'remove' requires map, list, or string").raise();
		return IntrinsicResult::Null;
	}